

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplaceRealloc<>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,pointer pos)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  size_type sVar4;
  _Storage<slang::ConstantRange,_true> *p_Var5;
  undefined8 uVar6;
  _Storage<slang::ConstantRange,_true> _Var7;
  pointer pLVar8;
  pointer pLVar9;
  pointer pLVar10;
  long lVar11;
  long lVar12;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar3 = this->cap;
  if (capacity < uVar3 * 2) {
    capacity = uVar3 * 2;
  }
  if (0x7fffffffffffffff - uVar3 < uVar3) {
    capacity = 0x7fffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pLVar9 = (pointer)detail::allocArray(capacity,0x18);
  *(undefined8 *)((long)pLVar9 + lVar12) = 0;
  ((undefined8 *)((long)pLVar9 + lVar12))[1] = 0;
  *(undefined8 *)((long)pLVar9 + lVar12 + 0x10) = 0;
  pLVar10 = this->data_;
  sVar4 = this->len;
  pLVar8 = pLVar9;
  if (pLVar10 + sVar4 == pos) {
    if (sVar4 != 0) {
      lVar11 = 0;
      do {
        *(undefined8 *)((long)&pLVar9->loopVar + lVar11) =
             *(undefined8 *)((long)&pLVar10->loopVar + lVar11);
        puVar1 = (undefined8 *)
                 ((long)&(pLVar10->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                         _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_payload +
                 lVar11);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&(pLVar9->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                         _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_payload +
                 lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar11 = lVar11 + 0x18;
      } while (sVar4 * 0x18 != lVar11);
    }
  }
  else {
    for (; pLVar10 != pos; pLVar10 = pLVar10 + 1) {
      pLVar8->loopVar = pLVar10->loopVar;
      uVar6 = *(undefined8 *)
               &(pLVar10->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      (pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload =
           (pLVar10->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>._M_payload;
      *(undefined8 *)
       &(pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar6;
      pLVar8 = pLVar8 + 1;
    }
    sVar4 = this->len;
    pLVar10 = this->data_;
    if (pLVar10 + sVar4 != pos) {
      p_Var5 = (_Storage<slang::ConstantRange,_true> *)((long)pLVar9 + lVar12);
      do {
        p_Var5[5] = (_Storage<slang::ConstantRange,_true>)pos->loopVar;
        _Var7 = *(_Storage<slang::ConstantRange,_true> *)
                 &(pos->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_engaged;
        p_Var5[3] = (pos->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload;
        p_Var5[4] = _Var7;
        pos = pos + 1;
        p_Var5 = p_Var5 + 3;
      } while (pos != pLVar10 + sVar4);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pLVar9;
  return (pointer)((long)pLVar9 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}